

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall duckdb::ColumnStatsUnifier::~ColumnStatsUnifier(ColumnStatsUnifier *this)

{
  this->_vptr_ColumnStatsUnifier = (_func_int **)&PTR__ColumnStatsUnifier_017b3e80;
  ::std::__cxx11::string::~string((string *)&this->global_max);
  ::std::__cxx11::string::~string((string *)&this->global_min);
  ::std::__cxx11::string::~string((string *)&this->column_name);
  return;
}

Assistant:

virtual ~ColumnStatsUnifier() = default;